

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O0

int mbedtls_asn1_write_null(uchar **p,uchar *start)

{
  int iVar1;
  size_t len;
  int ret;
  uchar *start_local;
  uchar **p_local;
  
  iVar1 = mbedtls_asn1_write_len(p,start,0);
  p_local._4_4_ = iVar1;
  if ((-1 < iVar1) && (p_local._4_4_ = mbedtls_asn1_write_tag(p,start,'\x05'), -1 < p_local._4_4_))
  {
    p_local._4_4_ = p_local._4_4_ + iVar1;
  }
  return p_local._4_4_;
}

Assistant:

int mbedtls_asn1_write_null( unsigned char **p, unsigned char *start )
{
    int ret;
    size_t len = 0;

    // Write NULL
    //
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( p, start, 0) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( p, start, MBEDTLS_ASN1_NULL ) );

    return( (int) len );
}